

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3e503::CleanTestCleanAllDryRun::Run(CleanTestCleanAllDryRun *this)

{
  State *state;
  VirtualFileSystem *this_00;
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  TimeStamp TVar4;
  allocator<char> local_109;
  string err;
  string local_e8;
  Cleaner cleaner;
  
  iVar3 = g_current_test->assertion_failures_;
  state = &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "build in1: cat src1\nbuild out1: cat in1\nbuild in2: cat src2\nbuild out2: cat in2\n"
              ,(ManifestParserOptions)0x0);
  if (iVar3 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cleaner,"in1",(allocator<char> *)&local_e8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&err,"",&local_109);
    this_00 = &(this->super_CleanTest).fs_;
    VirtualFileSystem::Create(this_00,(string *)&cleaner,&err);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&cleaner);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cleaner,"out1",(allocator<char> *)&local_e8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&err,"",&local_109);
    VirtualFileSystem::Create(this_00,(string *)&cleaner,&err);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&cleaner);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cleaner,"in2",(allocator<char> *)&local_e8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&err,"",&local_109);
    VirtualFileSystem::Create(this_00,(string *)&cleaner,&err);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&cleaner);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cleaner,"out2",(allocator<char> *)&local_e8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&err,"",&local_109);
    VirtualFileSystem::Create(this_00,(string *)&cleaner,&err);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&cleaner);
    (this->super_CleanTest).config_.dry_run = true;
    Cleaner::Cleaner(&cleaner,state,&(this->super_CleanTest).config_,&this_00->super_DiskInterface);
    bVar2 = testing::Test::Check
                      (g_current_test,cleaner.cleaned_files_count_ == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x54,"0 == cleaner.cleaned_files_count()");
    pTVar1 = g_current_test;
    if (bVar2) {
      iVar3 = Cleaner::CleanAll(&cleaner,false);
      testing::Test::Check
                (pTVar1,iVar3 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x55,"0 == cleaner.CleanAll()");
      testing::Test::Check
                (g_current_test,cleaner.cleaned_files_count_ == 4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x56,"4 == cleaner.cleaned_files_count()");
      testing::Test::Check
                (g_current_test,
                 (this->super_CleanTest).fs_.files_removed_._M_t._M_impl.super__Rb_tree_header.
                 _M_node_count == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x57,"0u == fs_.files_removed_.size()");
      pTVar1 = g_current_test;
      err._M_dataplus._M_p = (pointer)&err.field_2;
      err._M_string_length = 0;
      err.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"in1",&local_109);
      TVar4 = VirtualFileSystem::Stat(this_00,&local_e8,&err);
      testing::Test::Check
                (pTVar1,0 < TVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x5b,"0 < fs_.Stat(\"in1\", &err)");
      std::__cxx11::string::~string((string *)&local_e8);
      pTVar1 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"out1",&local_109);
      TVar4 = VirtualFileSystem::Stat(this_00,&local_e8,&err);
      testing::Test::Check
                (pTVar1,0 < TVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x5c,"0 < fs_.Stat(\"out1\", &err)");
      std::__cxx11::string::~string((string *)&local_e8);
      pTVar1 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"in2",&local_109);
      TVar4 = VirtualFileSystem::Stat(this_00,&local_e8,&err);
      testing::Test::Check
                (pTVar1,0 < TVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x5d,"0 < fs_.Stat(\"in2\", &err)");
      std::__cxx11::string::~string((string *)&local_e8);
      pTVar1 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"out2",&local_109);
      TVar4 = VirtualFileSystem::Stat(this_00,&local_e8,&err);
      testing::Test::Check
                (pTVar1,0 < TVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x5e,"0 < fs_.Stat(\"out2\", &err)");
      std::__cxx11::string::~string((string *)&local_e8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&(this->super_CleanTest).fs_.files_removed_._M_t);
      pTVar1 = g_current_test;
      iVar3 = Cleaner::CleanAll(&cleaner,false);
      testing::Test::Check
                (pTVar1,iVar3 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x61,"0 == cleaner.CleanAll()");
      testing::Test::Check
                (g_current_test,cleaner.cleaned_files_count_ == 4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x62,"4 == cleaner.cleaned_files_count()");
      testing::Test::Check
                (g_current_test,
                 (this->super_CleanTest).fs_.files_removed_._M_t._M_impl.super__Rb_tree_header.
                 _M_node_count == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,99,"0u == fs_.files_removed_.size()");
      std::__cxx11::string::~string((string *)&err);
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    Cleaner::~Cleaner(&cleaner);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanAllDryRun) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build in1: cat src1\n"
"build out1: cat in1\n"
"build in2: cat src2\n"
"build out2: cat in2\n"));
  fs_.Create("in1", "");
  fs_.Create("out1", "");
  fs_.Create("in2", "");
  fs_.Create("out2", "");

  config_.dry_run = true;
  Cleaner cleaner(&state_, config_, &fs_);

  ASSERT_EQ(0, cleaner.cleaned_files_count());
  EXPECT_EQ(0, cleaner.CleanAll());
  EXPECT_EQ(4, cleaner.cleaned_files_count());
  EXPECT_EQ(0u, fs_.files_removed_.size());

  // Check they are not removed.
  string err;
  EXPECT_LT(0, fs_.Stat("in1", &err));
  EXPECT_LT(0, fs_.Stat("out1", &err));
  EXPECT_LT(0, fs_.Stat("in2", &err));
  EXPECT_LT(0, fs_.Stat("out2", &err));
  fs_.files_removed_.clear();

  EXPECT_EQ(0, cleaner.CleanAll());
  EXPECT_EQ(4, cleaner.cleaned_files_count());
  EXPECT_EQ(0u, fs_.files_removed_.size());
}